

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
Catch::capturedExpressionWithSecondArgument(string *capturedExpression,string *secondArg)

{
  bool bVar1;
  ulong uVar2;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined7 in_stack_ffffffffffffffc0;
  byte bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  
  __lhs = in_RDI;
  uVar2 = std::__cxx11::string::empty();
  bVar3 = 0;
  if (((uVar2 & 1) != 0) || (bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffff98), bVar1)) {
    std::__cxx11::string::string((string *)in_RDI,in_RSI);
  }
  else {
    std::operator+(in_stack_ffffffffffffffc8,(char *)CONCAT17(bVar3,in_stack_ffffffffffffffc0));
    bVar3 = 1;
    std::operator+(__lhs,in_RDI);
  }
  if ((bVar3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  }
  return __lhs;
}

Assistant:

std::string capturedExpressionWithSecondArgument( std::string const& capturedExpression, std::string const& secondArg ) {
        return secondArg.empty() || secondArg == "\"\""
            ? capturedExpression
            : capturedExpression + ", " + secondArg;
    }